

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateInlineMethods
          (MessageGenerator *this,Printer *printer)

{
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *psVar1;
  long i;
  
  if (0 < *(int *)(this->descriptor_ + 0x38)) {
    i = 0;
    do {
      psVar1 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
               ::operator[](&this->nested_generators_,i);
      if (psVar1->ptr_ == (MessageGenerator *)0x0) {
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                      ,0x1e2,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->() const [C = google::protobuf::compiler::cxx::MessageGenerator]"
                     );
      }
      GenerateInlineMethods(psVar1->ptr_,printer);
      io::Printer::Print(printer,
                         "// -------------------------------------------------------------------\n")
      ;
      io::Printer::Print(printer,"\n");
      i = i + 1;
    } while (i < *(int *)(this->descriptor_ + 0x38));
  }
  GenerateFieldAccessorDefinitions(this,printer);
  return;
}

Assistant:

void MessageGenerator::
GenerateInlineMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->GenerateInlineMethods(printer);
    printer->Print(kThinSeparator);
    printer->Print("\n");
  }

  GenerateFieldAccessorDefinitions(printer);
}